

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tracing_imp.cpp
# Opt level: O2

size_t __thiscall tracing_layer::APITracerContextImp::updateTracerArrays(APITracerContextImp *this)

{
  undefined1 auVar1 [16];
  __pointer_type ptVar2;
  tracer_array_entry_t *__dest;
  size_t sVar3;
  ulong uVar4;
  _List_node_base *p_Var5;
  tracer_array_t *active_tracer_array_shadow;
  
  uVar4 = (this->enabledTracerImpList).
          super__List_base<tracing_layer::APITracerImp_*,_std::allocator<tracing_layer::APITracerImp_*>_>
          ._M_impl._M_node._M_size;
  if (uVar4 == 0) {
    ptVar2 = &this->emptyTracerArray;
  }
  else {
    ptVar2 = (__pointer_type)operator_new(0x10);
    ptVar2->tracerArrayCount = uVar4;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar4;
    uVar4 = 0xffffffffffffffff;
    if (SUB168(auVar1 * ZEXT816(0xcb8),8) == 0) {
      uVar4 = SUB168(auVar1 * ZEXT816(0xcb8),0);
    }
    __dest = (tracer_array_entry_t *)operator_new__(uVar4);
    ptVar2->tracerArrayEntries = __dest;
    p_Var5 = (_List_node_base *)&this->enabledTracerImpList;
    while (p_Var5 = (((_List_base<tracing_layer::APITracerImp_*,_std::allocator<tracing_layer::APITracerImp_*>_>
                       *)&p_Var5->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
          p_Var5 != (_List_node_base *)&this->enabledTracerImpList) {
      memcpy(__dest,(void *)((long)p_Var5[1]._M_next + 8),0xcb8);
      __dest = __dest + 1;
    }
  }
  active_tracer_array_shadow = (this->activeTracerArray)._M_b._M_p;
  if (&this->emptyTracerArray != active_tracer_array_shadow) {
    std::__cxx11::list<tracing_layer::tracerArray_*,_std::allocator<tracing_layer::tracerArray_*>_>
    ::push_back(&this->retiringTracerArrayList,&active_tracer_array_shadow);
  }
  (this->activeTracerArray)._M_b._M_p = ptVar2;
  sVar3 = testAndFreeRetiredTracers(this);
  return sVar3;
}

Assistant:

size_t APITracerContextImp::updateTracerArrays() {
    tracer_array_t *newTracerArray;
    size_t newTracerArrayCount = this->enabledTracerImpList.size();

    if (newTracerArrayCount != 0) {

        newTracerArray = new tracer_array_t;

        newTracerArray->tracerArrayCount = newTracerArrayCount;
        newTracerArray->tracerArrayEntries =
            new tracer_array_entry_t[newTracerArrayCount];
        //
        // iterate over the list of enabled tracers, copying their entries into the
        // new tracer array
        //
        size_t i = 0;
        std::list<struct APITracerImp *>::iterator itr;
        for (itr = enabledTracerImpList.begin(); itr != enabledTracerImpList.end();
             itr++) {
            newTracerArray->tracerArrayEntries[i] = (*itr)->tracerFunctions;
            i++;
        }

    } else {
        newTracerArray = &emptyTracerArray;
    }
    //
    // active_tracer_array.load can use memory_order_relaxed here because
    // there is logically no transfer of other memory context between
    // threads in this case.
    //
    tracer_array_t *active_tracer_array_shadow =
        activeTracerArray.load(std::memory_order_relaxed);
    if (active_tracer_array_shadow != &emptyTracerArray) {
        retiringTracerArrayList.push_back(active_tracer_array_shadow);
    }
    //
    // This active_tracer_array.store must use memory_order_release.
    // This store DOES signal a logical transfer of tracer state information
    // from this thread to the tracing threads.
    //
    activeTracerArray.store(newTracerArray, std::memory_order_release);
    return testAndFreeRetiredTracers();
}